

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O1

int __thiscall QtMWidgets::ToolBarPrivate::init(ToolBarPrivate *this,EVP_PKEY_CTX *ctx)

{
  Orientation OVar1;
  int extraout_EAX;
  ToolBarLayout *this_00;
  NavigationArrow *pNVar2;
  QSize local_20;
  
  this_00 = (ToolBarLayout *)operator_new(0x58);
  ToolBarLayout::ToolBarLayout(this_00,&this->q->super_QWidget);
  this->layout = this_00;
  OVar1 = this_00->orient;
  pNVar2 = (NavigationArrow *)operator_new(0x30);
  if (OVar1 == Horizontal) {
    NavigationArrow::NavigationArrow(pNVar2,Left,&this->q->super_QWidget);
  }
  else {
    NavigationArrow::NavigationArrow(pNVar2,Top,&this->q->super_QWidget);
  }
  this->left = pNVar2;
  OVar1 = this->layout->orient;
  pNVar2 = (NavigationArrow *)operator_new(0x30);
  if (OVar1 == Horizontal) {
    NavigationArrow::NavigationArrow(pNVar2,Right,&this->q->super_QWidget);
  }
  else {
    NavigationArrow::NavigationArrow(pNVar2,Bottom,&this->q->super_QWidget);
  }
  this->right = pNVar2;
  ToolBarLayout::setLeftArrow(this->layout,this->left);
  ToolBarLayout::setRightArrow(this->layout,this->right);
  QWidget::setSizePolicy((QSizePolicy)SUB84(this->q,0));
  QWidget::setBackgroundRole((ColorRole)this->q);
  QWidget::setAutoFillBackground(SUB81(this->q,0));
  local_20.wd = 0x20;
  local_20.ht = 0x20;
  ToolBar::setIconSize(this->q,&local_20);
  return extraout_EAX;
}

Assistant:

void
ToolBarPrivate::init()
{
	layout = new ToolBarLayout( q );

	if( layout->orientation() == Qt::Horizontal )
		left = new NavigationArrow( NavigationArrow::Left, q );
	else
		left = new NavigationArrow( NavigationArrow::Top, q );

	if( layout->orientation() == Qt::Horizontal )
		right = new NavigationArrow( NavigationArrow::Right, q );
	else
		right = new NavigationArrow( NavigationArrow::Bottom, q );

	layout->setLeftArrow( left );
	layout->setRightArrow( right );

	q->setSizePolicy( QSizePolicy(
		QSizePolicy::Preferred, QSizePolicy::Fixed ) );

	q->setBackgroundRole( QPalette::Base );
	q->setAutoFillBackground( true );
	q->setIconSize( QSize( 32, 32 ) );
}